

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O0

void __thiscall HighsPrimalHeuristics::rootReducedCost(HighsPrimalHeuristics *this)

{
  HighsDomainChange boundchg;
  bool bVar1;
  HighsInt HVar2;
  size_type sVar3;
  pointer pHVar4;
  double dVar5;
  iterator iVar6;
  iterator iVar7;
  reference ppVar8;
  double *pdVar9;
  double dVar10;
  Reason in_RDI;
  double fixingRate;
  double fixingRate_1;
  bool bound_change;
  double prev_lower_bound;
  pair<double,_HighsDomainChange> *domchg;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
  *__range1;
  double lower_bound;
  double currCutoff;
  HeuristicNeighbourhood neighbourhood;
  HighsDomain localdom;
  vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
  lurkingBounds;
  HighsInt in_stack_000006dc;
  vector<double,_std::allocator<double>_> *in_stack_000006e0;
  vector<double,_std::allocator<double>_> *in_stack_000006e8;
  double in_stack_000006f0;
  HighsBasis *in_stack_000006f8;
  HighsLp *in_stack_00000700;
  HighsPrimalHeuristics *in_stack_00000708;
  HighsInt in_stack_00000720;
  HighsInt in_stack_00000728;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  HeuristicNeighbourhood *in_stack_fffffffffffffae0;
  HighsDomainChange *in_stack_fffffffffffffae8;
  HighsDomain *in_stack_fffffffffffffaf0;
  pointer in_stack_fffffffffffffb18;
  HighsDomain *in_stack_fffffffffffffb20;
  HighsDomain *pHVar11;
  HighsMipSolver *in_stack_fffffffffffffb28;
  HeuristicNeighbourhood *in_stack_fffffffffffffb30;
  HighsDomain *this_00;
  HighsMipSolver *in_stack_fffffffffffffb80;
  undefined6 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8e;
  undefined1 in_stack_fffffffffffffb8f;
  HighsDomain *in_stack_fffffffffffffb90;
  HighsConflictPool *in_stack_fffffffffffffb98;
  HighsDomain *in_stack_fffffffffffffba0;
  double in_stack_fffffffffffffba8;
  HighsMipSolverData *in_stack_fffffffffffffbb0;
  __normal_iterator<std::pair<double,_HighsDomainChange>_*,_std::vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>_>
  local_3f8;
  undefined1 *local_3f0;
  double local_3e8;
  double local_3e0;
  HighsDomain *in_stack_fffffffffffffc28;
  HighsDomain *in_stack_fffffffffffffc30;
  HighsDomain *in_stack_fffffffffffffd68;
  
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x66f3ee);
  HighsRedcostFixing::getLurkingBounds
            ((HighsRedcostFixing *)
             CONCAT17(in_stack_fffffffffffffb8f,
                      CONCAT16(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88)),
             in_stack_fffffffffffffb80);
  sVar3 = std::
          vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
          ::size((vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                  *)&stack0xffffffffffffffe0);
  dVar10 = (double)(sVar3 * 10);
  pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x66f443);
  dVar5 = (double)std::vector<int,_std::allocator<int>_>::size(&pHVar4->integral_cols);
  if ((ulong)dVar5 <= (ulong)dVar10) {
    this_00 = (HighsDomain *)&stack0xffffffffffffffe0;
    iVar6 = std::
            vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
            ::begin((vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                     *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    iVar7 = std::
            vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
            ::end((vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                   *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    pdqsort<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0>
              (iVar6._M_current,iVar7._M_current);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x66f4d2)
    ;
    HighsDomain::HighsDomain(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    HeuristicNeighbourhood::HeuristicNeighbourhood
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    local_3e0 = INFINITY;
    pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66f535);
    dVar5 = pHVar4->lower_bound;
    pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x66f560);
    local_3e8 = dVar5 + pHVar4->feastol;
    local_3f0 = &stack0xffffffffffffffe0;
    local_3f8._M_current =
         (pair<double,_HighsDomainChange> *)
         std::
         vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
         ::begin((vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
                  *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    std::
    vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
    ::end((vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
           *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<double,_HighsDomainChange>_*,_std::vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                              (__normal_iterator<std::pair<double,_HighsDomainChange>_*,_std::vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8)),
          bVar1) {
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<double,_HighsDomainChange>_*,_std::vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>_>
               ::operator*(&local_3f8);
      local_3e0 = ppVar8->first;
      if (local_3e0 <= local_3e8) break;
      bVar1 = HighsDomain::isActive(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      if (!bVar1) {
        HighsDomain::Reason::branching();
        boundchg._8_8_ = in_stack_fffffffffffffb80;
        boundchg.boundval = dVar10;
        HighsDomain::changeBound(this_00,boundchg,in_RDI);
        while( true ) {
          HighsDomain::propagate(in_stack_fffffffffffffd68);
          bVar1 = HighsDomain::infeasible((HighsDomain *)&stack0xfffffffffffffc78);
          if (!bVar1) break;
          std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x66f743);
          HighsDomain::conflictAnalysis(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
          pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x66f773);
          pHVar11 = (HighsDomain *)pHVar4->lower_bound;
          pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x66f79e);
          pdVar9 = std::max<double>(&pHVar4->lower_bound,&local_3e0);
          dVar5 = *pdVar9;
          pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x66f7e2);
          pHVar4->lower_bound = dVar5;
          pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x66f80a);
          if (((*(byte *)(*(long *)in_RDI + 0xb0) & 1) == 0) &&
             (pHVar4->lower_bound != (double)pHVar11)) {
            in_stack_fffffffffffffb18 =
                 std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x66f86d);
            std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
            operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                       0x66f89b);
            std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
            operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                       0x66f8c3);
            std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
            operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                       0x66f8eb);
            HighsMipSolverData::updatePrimalDualIntegral
                      (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                       (double)in_stack_fffffffffffffba0,(double)in_stack_fffffffffffffb98,
                       (double)in_stack_fffffffffffffb90,(bool)in_stack_fffffffffffffb8f,
                       (bool)in_stack_fffffffffffffb8e);
            in_stack_fffffffffffffb20 = pHVar11;
          }
          HighsDomain::backtrack(in_stack_fffffffffffffb90);
          HVar2 = HighsDomain::getBranchDepth((HighsDomain *)0x66f95d);
          if (HVar2 == 0) break;
          HeuristicNeighbourhood::backtracked
                    ((HeuristicNeighbourhood *)
                     CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
        }
        dVar5 = HeuristicNeighbourhood::getFixingRate(in_stack_fffffffffffffae0);
        if (0.5 <= dVar5) break;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<double,_HighsDomainChange>_*,_std::vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>_>
      ::operator++(&local_3f8);
    }
    dVar5 = HeuristicNeighbourhood::getFixingRate(in_stack_fffffffffffffae0);
    if (0.3 <= dVar5) {
      pHVar4 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x66fa3c);
      in_stack_fffffffffffffae0 = (HeuristicNeighbourhood *)&pHVar4->firstrootbasis;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb20,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb18);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb20,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb18);
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x66fa9b);
      in_stack_fffffffffffffad0 = 0xc;
      solveSubMip(in_stack_00000708,in_stack_00000700,in_stack_000006f8,in_stack_000006f0,
                  in_stack_000006e8,in_stack_000006e0,in_stack_000006dc,in_stack_00000720,
                  in_stack_00000728);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0);
    }
    HeuristicNeighbourhood::~HeuristicNeighbourhood((HeuristicNeighbourhood *)0x66fb3f);
    HighsDomain::~HighsDomain
              ((HighsDomain *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  }
  std::
  vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
  ::~vector((vector<std::pair<double,_HighsDomainChange>,_std::allocator<std::pair<double,_HighsDomainChange>_>_>
             *)in_stack_fffffffffffffae0);
  return;
}

Assistant:

void HighsPrimalHeuristics::rootReducedCost() {
  std::vector<std::pair<double, HighsDomainChange>> lurkingBounds =
      mipsolver.mipdata_->redcostfixing.getLurkingBounds(mipsolver);
  if (10 * lurkingBounds.size() < mipsolver.mipdata_->integral_cols.size())
    return;
  pdqsort(lurkingBounds.begin(), lurkingBounds.end(),
          [](const std::pair<double, HighsDomainChange>& a,
             const std::pair<double, HighsDomainChange>& b) {
            return a.first > b.first;
          });

  auto localdom = mipsolver.mipdata_->domain;

  HeuristicNeighbourhood neighbourhood(mipsolver, localdom);

  double currCutoff = kHighsInf;
  double lower_bound;

  lower_bound = mipsolver.mipdata_->lower_bound + mipsolver.mipdata_->feastol;

  for (const std::pair<double, HighsDomainChange>& domchg : lurkingBounds) {
    currCutoff = domchg.first;

    if (currCutoff <= lower_bound) break;

    if (localdom.isActive(domchg.second)) continue;
    localdom.changeBound(domchg.second);

    while (true) {
      localdom.propagate();
      if (localdom.infeasible()) {
        localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);

        double prev_lower_bound = mipsolver.mipdata_->lower_bound;

        mipsolver.mipdata_->lower_bound =
            std::max(mipsolver.mipdata_->lower_bound, currCutoff);

        const bool bound_change =
            mipsolver.mipdata_->lower_bound != prev_lower_bound;
        if (!mipsolver.submip && bound_change)
          mipsolver.mipdata_->updatePrimalDualIntegral(
              prev_lower_bound, mipsolver.mipdata_->lower_bound,
              mipsolver.mipdata_->upper_bound, mipsolver.mipdata_->upper_bound);
        localdom.backtrack();
        if (localdom.getBranchDepth() == 0) break;
        neighbourhood.backtracked();
        continue;
      }
      break;
    }
    double fixingRate = neighbourhood.getFixingRate();
    if (fixingRate >= 0.5) break;
    // double gap = (currCutoff - mipsolver.mipdata_->lower_bound) /
    //             std::max(std::abs(mipsolver.mipdata_->lower_bound), 1.0);
    // if (gap < 0.001) break;
  }

  double fixingRate = neighbourhood.getFixingRate();
  if (fixingRate < 0.3) return;

  solveSubMip(*mipsolver.model_, mipsolver.mipdata_->firstrootbasis, fixingRate,
              localdom.col_lower_, localdom.col_upper_,
              500,  // std::max(50, int(0.05 *
                    // (mipsolver.mipdata_->num_leaves))),
              200 + mipsolver.mipdata_->num_nodes / 20, 12);
}